

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O1

void draw_2_handles_for_line
               (int x1,int y1,int x2,int y2,bool filled,Am_Drawonable *draw,Am_Style *style,
               Am_Object *handle_shape,Am_Style *special_style,
               Am_Move_Grow_Where_Attach special_style_where)

{
  Am_Style *prev;
  Am_Style local_40;
  Am_Style local_38;
  
  prev = style;
  if (Am_ATTACH_END_1.value == special_style_where.value) {
    prev = special_style;
  }
  Am_Style::Am_Style(&local_38,prev);
  draw_handle(x1 + -7,y1 + -7,filled,draw,&local_38,handle_shape);
  Am_Style::~Am_Style(&local_38);
  if (Am_ATTACH_END_2.value == special_style_where.value) {
    style = special_style;
  }
  Am_Style::Am_Style(&local_40,style);
  draw_handle(x2 + -7,y2 + -7,filled,draw,&local_40,handle_shape);
  Am_Style::~Am_Style(&local_40);
  return;
}

Assistant:

void
draw_2_handles_for_line(
    int x1, int y1, int x2, int y2, bool filled, Am_Drawonable *draw,
    Am_Style style,
    Am_Object &handle_shape, //supports multiple users
    Am_Style special_style = Am_No_Style,
    Am_Move_Grow_Where_Attach special_style_where = Am_ATTACH_WHERE_HIT // 0
    )
{
  draw_handle(x1 - HANDLE_SIZE_D2, y1 - HANDLE_SIZE_D2, filled, draw,
              (special_style_where == Am_ATTACH_END_1) ? special_style : style,
              handle_shape); //supports multiple users

  draw_handle(x2 - HANDLE_SIZE_D2, y2 - HANDLE_SIZE_D2, filled, draw,
              (special_style_where == Am_ATTACH_END_2) ? special_style : style,
              handle_shape); //supports multiple users
}